

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_RestoreState(CLzmaEncHandle pp)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int local_24;
  int i;
  CSaveState *p;
  CLzmaEnc *dest;
  CLzmaEncHandle pp_local;
  
  memcpy((void *)((long)pp + 0x3424c),(void *)((long)pp + 0x3d9e4),0x4848);
  memcpy((void *)((long)pp + 0x38a94),(void *)((long)pp + 0x4222c),0x4848);
  *(undefined4 *)((long)pp + 0x32f80) = *(undefined4 *)((long)pp + 0x46a84);
  for (local_24 = 0; local_24 < 0xc; local_24 = local_24 + 1) {
    puVar1 = (undefined8 *)((long)pp + (long)local_24 * 0x20 + 0x33be8);
    puVar2 = (undefined8 *)((long)pp + (long)local_24 * 0x20 + 0x3d380);
    *puVar1 = *puVar2;
    puVar1[1] = puVar2[1];
    puVar1[2] = puVar2[2];
    puVar1[3] = puVar2[3];
    puVar1 = (undefined8 *)((long)pp + (long)local_24 * 0x20 + 0x33dc8);
    puVar2 = (undefined8 *)((long)pp + (long)local_24 * 0x20 + 0x3d560);
    *puVar1 = *puVar2;
    puVar1[1] = puVar2[1];
    puVar1[2] = puVar2[2];
    puVar1[3] = puVar2[3];
  }
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    memcpy((void *)((long)pp + (long)local_24 * 0x80 + 0x33f48),
           (void *)((long)pp + (long)local_24 * 0x80 + 0x3d6e0),0x80);
  }
  *(undefined8 *)((long)pp + 0x33d68) = *(undefined8 *)((long)pp + 0x3d500);
  *(undefined8 *)((long)pp + 0x33d70) = *(undefined8 *)((long)pp + 0x3d508);
  *(undefined8 *)((long)pp + 0x33d78) = *(undefined8 *)((long)pp + 0x3d510);
  *(undefined8 *)((long)pp + 0x33d80) = *(undefined8 *)((long)pp + 0x3d518);
  *(undefined8 *)((long)pp + 0x33d88) = *(undefined8 *)((long)pp + 0x3d520);
  *(undefined8 *)((long)pp + 0x33d90) = *(undefined8 *)((long)pp + 0x3d528);
  *(undefined8 *)((long)pp + 0x33d98) = *(undefined8 *)((long)pp + 0x3d530);
  *(undefined8 *)((long)pp + 0x33da0) = *(undefined8 *)((long)pp + 0x3d538);
  *(undefined8 *)((long)pp + 0x33da8) = *(undefined8 *)((long)pp + 0x3d540);
  *(undefined8 *)((long)pp + 0x33db0) = *(undefined8 *)((long)pp + 0x3d548);
  *(undefined8 *)((long)pp + 0x33db8) = *(undefined8 *)((long)pp + 0x3d550);
  *(undefined8 *)((long)pp + 0x33dc0) = *(undefined8 *)((long)pp + 0x3d558);
  memcpy((void *)((long)pp + 0x34148),(void *)((long)pp + 0x3d8e0),0xe4);
  *(undefined8 *)((long)pp + 0x3422c) = *(undefined8 *)((long)pp + 0x3d9c4);
  *(undefined8 *)((long)pp + 0x34234) = *(undefined8 *)((long)pp + 0x3d9cc);
  *(undefined8 *)((long)pp + 0x3423c) = *(undefined8 *)((long)pp + 0x3d9d4);
  *(undefined8 *)((long)pp + 0x34244) = *(undefined8 *)((long)pp + 0x3d9dc);
  *(undefined8 *)((long)pp + 0x32f70) = *(undefined8 *)((long)pp + 0x46a74);
  *(undefined8 *)((long)pp + 0x32f78) = *(undefined8 *)((long)pp + 0x46a7c);
  memcpy(*(void **)((long)pp + 0x33be0),*(void **)((long)pp + 0x3d378),
         (long)(0x300 << ((byte)*(undefined4 *)((long)pp + 0x3d2dc) & 0x1f)) << 1);
  return;
}

Assistant:

void LzmaEnc_RestoreState(CLzmaEncHandle pp) {
  CLzmaEnc* dest = (CLzmaEnc*)pp;
  const CSaveState* p = &dest->saveState;
  int i;
  dest->lenEnc = p->lenEnc;
  dest->repLenEnc = p->repLenEnc;
  dest->state = p->state;

  for (i = 0; i < kNumStates; i++) {
    memcpy(dest->isMatch[i], p->isMatch[i], sizeof(p->isMatch[i]));
    memcpy(dest->isRep0Long[i], p->isRep0Long[i], sizeof(p->isRep0Long[i]));
  }
  for (i = 0; i < kNumLenToPosStates; i++)
    memcpy(dest->posSlotEncoder[i], p->posSlotEncoder[i], sizeof(p->posSlotEncoder[i]));
  memcpy(dest->isRep, p->isRep, sizeof(p->isRep));
  memcpy(dest->isRepG0, p->isRepG0, sizeof(p->isRepG0));
  memcpy(dest->isRepG1, p->isRepG1, sizeof(p->isRepG1));
  memcpy(dest->isRepG2, p->isRepG2, sizeof(p->isRepG2));
  memcpy(dest->posEncoders, p->posEncoders, sizeof(p->posEncoders));
  memcpy(dest->posAlignEncoder, p->posAlignEncoder, sizeof(p->posAlignEncoder));
  memcpy(dest->reps, p->reps, sizeof(p->reps));
  memcpy(dest->litProbs, p->litProbs, (0x300 << dest->lclp) * sizeof(CLzmaProb));
}